

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_exception.cc
# Opt level: O2

void __thiscall ExceptionIDNotFound::ExceptionIDNotFound(ExceptionIDNotFound *this,ID *id)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_51);
  Exception::Exception(&this->super_Exception,&id->super_Object,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  this->id_ = id;
  strfmt_abi_cxx11_(&local_50,"`%s\' undeclared",(id->name)._M_dataplus._M_p);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

ExceptionIDNotFound::ExceptionIDNotFound(const ID* id) : Exception(id), id_(id)
	{
	append(strfmt("`%s' undeclared", id_->Name()));
	}